

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  ThreadedSocketAcceptor *this;
  SocketAcceptor *this_00;
  allocator<char> local_229;
  string file;
  string local_208;
  Application application;
  SessionSettings settings;
  FileStoreFactory factory;
  
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  iVar1 = getopt(argc,argv,"+f:");
  if (iVar1 != 0x66) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," -f FILE [-t]");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&file);
    return 1;
  }
  std::__cxx11::string::assign((char *)&file);
  iVar1 = getopt(argc,argv,"+t");
  FIX::SessionSettings::SessionSettings(&settings,(string *)&file,false);
  Application::Application(&application);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"store",&local_229);
  FIX::FileStoreFactory::FileStoreFactory(&factory,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  if (iVar1 == 0x74) {
    this = (ThreadedSocketAcceptor *)operator_new(0x228);
    FIX::ThreadedSocketAcceptor::ThreadedSocketAcceptor
              (this,&application.super_Application,(MessageStoreFactory *)&factory,&settings);
  }
  else {
    this_00 = (SocketAcceptor *)operator_new(0x1d0);
    FIX::SocketAcceptor::SocketAcceptor
              (this_00,&application.super_Application,(MessageStoreFactory *)&factory,&settings);
  }
  FIX::Acceptor::start();
  do {
    FIX::process_sleep(1.0);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  std::string file;
  bool threaded = false;

  if (getopt(argc, argv, "+f:") == 'f') {
    file = optarg;
  } else {
    std::cout << "usage: " << argv[0] << " -f FILE [-t]" << std::endl;
    return 1;
  }

  if (getopt(argc, argv, "+t") == 't') {
    threaded = true;
  }

  try {
    FIX::SessionSettings settings(file);
    Application application;
    FIX::FileStoreFactory factory("store");

    AcceptorPtr pAcceptor;
    if (threaded) {
      pAcceptor.reset(new FIX::ThreadedSocketAcceptor(application, factory, settings));
    } else {
      pAcceptor.reset(new FIX::SocketAcceptor(application, factory, settings));
    }

    pAcceptor->start();
    while (true) {
      FIX::process_sleep(1);
    }
    pAcceptor->stop();
  } catch (std::exception &e) {
    std::cout << e.what();
    return 2;
  }

  return 0;
}